

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::create
          (SourceManager *sourceManager,
          span<const_slang::SourceBuffer,_18446744073709551615UL> sources,Bag *options,
          MacroList inheritedMacros,bool guess)

{
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  string_view name;
  SourceBuffer buffer;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources_00;
  byte bVar1;
  bool bVar2;
  reference pSVar3;
  invalid_argument *piVar4;
  SourceManager *sourceManager_00;
  SyntaxTree *__p;
  __extent_storage<18446744073709551615UL> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer in_RSI;
  element_type *in_RDI;
  SourceManager *in_R8;
  byte in_R9B;
  shared_ptr<slang::syntax::SyntaxTree> sVar5;
  MacroList in_stack_00000000;
  Preprocessor *in_stack_00000010;
  SyntaxNode *root;
  Parser parser;
  reverse_iterator it;
  SourceLibrary *library;
  Preprocessor preprocessor;
  Diagnostics diagnostics;
  BumpAllocator alloc;
  TimeTraceScope timeScope;
  size_t in_stack_fffffffffffff5b8;
  __extent_storage<18446744073709551615UL> _Var6;
  BumpAllocator *in_stack_fffffffffffff5c0;
  Preprocessor *pPVar7;
  SourceLibrary *in_stack_fffffffffffff5c8;
  Parser *in_stack_fffffffffffff5d0;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_intptr_t
  *in_stack_fffffffffffff5d8;
  intptr_t in_stack_fffffffffffff5e0;
  size_t in_stack_fffffffffffff5e8;
  Preprocessor *in_stack_fffffffffffff5f0;
  Preprocessor *in_stack_fffffffffffff5f8;
  undefined7 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff607;
  SyntaxTree *in_stack_fffffffffffff608;
  SyntaxTree *in_stack_fffffffffffff610;
  Parser *in_stack_fffffffffffff618;
  ParserMetadata *in_stack_fffffffffffff620;
  SourceLibrary *in_stack_fffffffffffff628;
  pointer in_stack_fffffffffffff630;
  undefined7 in_stack_fffffffffffff648;
  undefined1 in_stack_fffffffffffff64f;
  Parser *in_stack_fffffffffffff6b8;
  Preprocessor local_938;
  Bag *local_568;
  Preprocessor *pPStack_560;
  SourceLibrary *local_558;
  Parser *pPStack_550;
  SourceLibrary *local_530;
  size_t local_528;
  Bag *in_stack_fffffffffffffb08;
  Diagnostics *in_stack_fffffffffffffb10;
  BumpAllocator *in_stack_fffffffffffffb18;
  SourceManager *in_stack_fffffffffffffb20;
  Preprocessor *in_stack_fffffffffffffb28;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffca0;
  anon_class_16_2_4749af83 local_70;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  bVar2 = std::span<const_slang::SourceBuffer,_18446744073709551615UL>::empty
                    ((span<const_slang::SourceBuffer,_18446744073709551615UL> *)0xca1c6b);
  if (bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"sources cannot be empty");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_50 = ::sv((char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  local_70.sources =
       (span<const_slang::SourceBuffer,_18446744073709551615UL> *)&stack0xffffffffffffffe8;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_syntax_SyntaxTree_cpp:139:45)>
            (&local_60,&local_70);
  name._M_str = (char *)in_stack_fffffffffffff5f0;
  name._M_len = in_stack_fffffffffffff5e8;
  detail.callable = in_stack_fffffffffffff5e0;
  detail.callback = in_stack_fffffffffffff5d8;
  TimeTraceScope::TimeTraceScope((TimeTraceScope *)in_stack_fffffffffffff5d0,name,detail);
  BumpAllocator::BumpAllocator(in_stack_fffffffffffff5c0);
  Diagnostics::Diagnostics((Diagnostics *)0xca1d7f);
  _Var6 = in_stack_00000000._M_extent._M_extent_value;
  pPVar7 = in_stack_00000010;
  local_528 = _Var6._M_extent_value;
  parsing::Preprocessor::Preprocessor
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffca0);
  local_530 = (SourceLibrary *)0x0;
  std::span<const_slang::SourceBuffer,_18446744073709551615UL>::rbegin
            ((span<const_slang::SourceBuffer,_18446744073709551615UL> *)in_stack_fffffffffffff5c8);
  while( true ) {
    std::span<const_slang::SourceBuffer,_18446744073709551615UL>::rend
              ((span<const_slang::SourceBuffer,_18446744073709551615UL> *)in_stack_fffffffffffff5c8)
    ;
    bVar2 = std::
            operator==<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff5d0,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff5c8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pSVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                          *)pPVar7);
    _Var6._M_extent_value = (pSVar3->data)._M_len;
    pPVar7 = (Preprocessor *)(pSVar3->data)._M_str;
    in_stack_fffffffffffff5c8 = pSVar3->library;
    in_stack_fffffffffffff5d0 = *(Parser **)&pSVar3->id;
    buffer.data._M_len._7_1_ = in_stack_fffffffffffff607;
    buffer.data._M_len._0_7_ = in_stack_fffffffffffff600;
    buffer.data._M_str = &in_stack_fffffffffffff608->isLibraryUnit;
    buffer.library = (SourceLibrary *)in_stack_fffffffffffff610;
    buffer._24_8_ = in_stack_fffffffffffff618;
    local_568 = (Bag *)_Var6._M_extent_value;
    pPStack_560 = pPVar7;
    local_558 = in_stack_fffffffffffff5c8;
    pPStack_550 = in_stack_fffffffffffff5d0;
    parsing::Preprocessor::pushSource(in_stack_fffffffffffff5f0,buffer);
    std::span<const_slang::SourceBuffer,_18446744073709551615UL>::rbegin
              ((span<const_slang::SourceBuffer,_18446744073709551615UL> *)in_stack_fffffffffffff5c8)
    ;
    in_stack_fffffffffffff64f =
         std::
         operator==<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                   ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff5d0,
                    (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff5c8);
    bVar2 = false;
    if (((in_stack_fffffffffffff64f ^ 0xff) & 1) != 0) {
      in_stack_fffffffffffff628 = local_530;
      in_stack_fffffffffffff630 =
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                         *)pPVar7);
      bVar2 = in_stack_fffffffffffff628 != in_stack_fffffffffffff630->library;
    }
    if (bVar2) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,
                 "All sources provided to a single SyntaxTree must be from the same source library")
      ;
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    in_stack_fffffffffffff618 =
         (Parser *)
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
         ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                       *)pPVar7);
    local_530 = (SourceLibrary *)(in_stack_fffffffffffff618->super_ParserBase).window.buffer;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SourceBuffer_*,_std::span<const_slang::SourceBuffer,_18446744073709551615UL>_>_>
                  *)in_stack_fffffffffffff5c8,(int)((ulong)pPVar7 >> 0x20));
  }
  parsing::Parser::Parser
            ((Parser *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
             in_stack_fffffffffffff5f8,(Bag *)in_stack_fffffffffffff5f0);
  if ((bVar1 & 1) == 0) {
    in_stack_fffffffffffff610 =
         (SyntaxTree *)parsing::Parser::parseCompilationUnit(in_stack_fffffffffffff6b8);
    local_938.options.predefines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff610;
  }
  else {
    in_stack_fffffffffffff608 = (SyntaxTree *)parsing::Parser::parseGuess(in_stack_fffffffffffff618)
    ;
    local_938.options.predefines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff608;
    in_stack_fffffffffffff607 = parsing::Parser::isDone(in_stack_fffffffffffff5d0);
    if (!(bool)in_stack_fffffffffffff607) {
      local_938.options.predefineSource._M_dataplus._M_p =
           (pointer)in_stack_00000000._M_extent._M_extent_value;
      sources_00._M_extent._M_extent_value = in_RDX._M_extent_value;
      sources_00._M_ptr = in_RSI;
      create(in_R8,sources_00,(Bag *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),in_stack_00000000,
             (bool)in_stack_ffffffffffffffcf);
      goto LAB_00ca22d0;
    }
  }
  sourceManager_00 = (SourceManager *)operator_new(0xca2150);
  __p = (SyntaxTree *)parsing::Parser::getMetadata(in_stack_fffffffffffff5d0);
  parsing::Preprocessor::getDefinedMacros
            ((Preprocessor *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648));
  Bag::Bag((Bag *)pPVar7,(Bag *)_Var6._M_extent_value);
  pPVar7 = &local_938;
  SyntaxTree(in_stack_fffffffffffff610,(SyntaxNode *)in_stack_fffffffffffff608,
             (SourceLibrary *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
             sourceManager_00,(BumpAllocator *)__p,(Diagnostics *)in_RSI,in_stack_fffffffffffff620,
             (vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              *)in_stack_fffffffffffff628,(Bag *)in_stack_fffffffffffff630);
  std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr<slang::syntax::SyntaxTree,void>
            ((shared_ptr<slang::syntax::SyntaxTree> *)pPVar7,__p);
  Bag::~Bag((Bag *)0xca223f);
  std::
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~vector((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             *)in_stack_fffffffffffff5d0);
  in_stack_00000010 = pPVar7;
LAB_00ca22d0:
  local_938.options.languageVersion = v1800_2023;
  parsing::Parser::~Parser((Parser *)in_stack_00000010);
  parsing::Preprocessor::~Preprocessor(in_stack_00000010);
  Diagnostics::~Diagnostics((Diagnostics *)0xca22f7);
  BumpAllocator::~BumpAllocator((BumpAllocator *)in_stack_00000010);
  TimeTraceScope::~TimeTraceScope((TimeTraceScope *)0xca2311);
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::create(SourceManager& sourceManager,
                                               std::span<const SourceBuffer> sources,
                                               const Bag& options, MacroList inheritedMacros,
                                               bool guess) {
    if (sources.empty())
        SLANG_THROW(std::invalid_argument("sources cannot be empty"));

    TimeTraceScope timeScope("parseFile"sv, [&] {
        if (sources.size() == 1)
            return std::string(sourceManager.getRawFileName(sources[0].id));
        else
            return "<multi-buffer>"s;
    });

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, options, inheritedMacros);

    const SourceLibrary* library = nullptr;
    for (auto it = sources.rbegin(); it != sources.rend(); it++) {
        preprocessor.pushSource(*it);

        if (it != sources.rbegin() && library != it->library) {
            SLANG_THROW(std::invalid_argument("All sources provided to a single SyntaxTree must be "
                                              "from the same source library"));
        }

        library = it->library;
    }

    Parser parser(preprocessor, options);

    SyntaxNode* root;
    if (!guess)
        root = &parser.parseCompilationUnit();
    else {
        root = &parser.parseGuess();
        if (!parser.isDone())
            return create(sourceManager, sources, options, inheritedMacros, false);
    }

    return std::shared_ptr<SyntaxTree>(
        new SyntaxTree(root, library, sourceManager, std::move(alloc), std::move(diagnostics),
                       parser.getMetadata(), preprocessor.getDefinedMacros(), options));
}